

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_format_one_pixel(void *src,rf_uncompressed_pixel_format src_format,void *dst,
                        rf_uncompressed_pixel_format dst_format)

{
  _Bool _Var1;
  int iVar2;
  rf_color rVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  rf_vec4 rVar8;
  float local_e8;
  float fStack_e4;
  rf_vec4 normalized_9;
  rf_vec4 normalized_8;
  rf_vec4 normalized_7;
  rf_vec4 normalized_6;
  uchar a_1;
  uchar b_2;
  uchar g_2;
  uchar r_2;
  rf_vec4 normalized_5;
  uchar a;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  int ALPHA_THRESHOLD;
  rf_vec4 normalized_4;
  rf_vec4 normalized_3;
  uchar b;
  uchar g;
  float fStack_64;
  uchar r;
  rf_vec4 normalized_2;
  rf_vec4 normalized_1;
  rf_vec4 normalized;
  undefined8 local_2c;
  rf_uncompressed_pixel_format dst_format_local;
  void *dst_local;
  rf_uncompressed_pixel_format src_format_local;
  void *src_local;
  
  if (((src_format == dst_format) && (_Var1 = rf_is_uncompressed_format(src_format), _Var1)) &&
     (_Var1 = rf_is_uncompressed_format(dst_format), _Var1)) {
    iVar2 = rf_bytes_per_pixel(src_format);
    memcpy(dst,src,(long)iVar2);
  }
  else {
    _Var1 = rf_is_uncompressed_format(src_format);
    if ((_Var1) && (dst_format == RF_UNCOMPRESSED_NORMALIZED)) {
      rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
      stack0xffffffffffffffcc = rVar8._0_8_;
      *(undefined8 *)dst = stack0xffffffffffffffcc;
      local_2c = rVar8._8_8_;
      *(undefined8 *)((long)dst + 8) = local_2c;
    }
    else {
      _Var1 = rf_is_uncompressed_format(src_format);
      if ((_Var1) && (dst_format == RF_UNCOMPRESSED_R8G8B8A8)) {
        rVar3 = rf_format_one_pixel_to_rgba32(src,src_format);
        *(rf_color *)dst = rVar3;
      }
      else {
        _Var1 = rf_is_uncompressed_format(src_format);
        if ((_Var1) && (_Var1 = rf_is_uncompressed_format(dst_format), _Var1)) {
          switch(dst_format) {
          case RF_UNCOMPRESSED_GRAYSCALE:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            normalized_1.z = rVar8.x;
            normalized_1.w = rVar8.y;
            normalized.x = rVar8.z;
            *(char *)dst = (char)(int)((normalized.x * 0.114 +
                                       normalized_1.z * 0.299 + normalized_1.w * 0.587) * 255.0);
            break;
          case RF_UNCOMPRESSED_GRAY_ALPHA:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            normalized_2.z = rVar8.x;
            normalized_2.w = rVar8.y;
            normalized_1.x = rVar8.z;
            *(char *)dst = (char)(int)((normalized_1.x * 0.114 +
                                       normalized_2.z * 0.299 + normalized_2.w * 0.587) * 255.0);
            normalized_1.y = rVar8.w;
            *(char *)((long)dst + 1) = (char)(int)(normalized_1.y * 255.0);
            break;
          case RF_UNCOMPRESSED_R5G6B5:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            normalized_3.w = rVar8.x;
            dVar4 = round((double)(normalized_3.w * 31.0));
            fStack_64 = rVar8.y;
            dVar5 = round((double)(fStack_64 * 63.0));
            normalized_2.x = rVar8.z;
            dVar6 = round((double)(normalized_2.x * 31.0));
            *(ushort *)dst =
                 (ushort)(byte)(int)dVar4 << 0xb | (ushort)(byte)(int)dVar5 << 5 |
                 (ushort)(byte)(int)dVar6;
            break;
          case RF_UNCOMPRESSED_R8G8B8:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            normalized_4.z = rVar8.x;
            *(char *)dst = (char)(int)(normalized_4.z * 255.0);
            normalized_4.w = rVar8.y;
            *(char *)((long)dst + 1) = (char)(int)(normalized_4.w * 255.0);
            normalized_3.x = rVar8.z;
            *(char *)((long)dst + 2) = (char)(int)(normalized_3.x * 255.0);
            break;
          case RF_UNCOMPRESSED_R5G5B5A1:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            _a = rVar8.x;
            dVar4 = round((double)(_a * 31.0));
            ALPHA_THRESHOLD = (int)rVar8.y;
            dVar5 = round((double)((float)ALPHA_THRESHOLD * 31.0));
            normalized_4.x = rVar8.z;
            dVar6 = round((double)(normalized_4.x * 31.0));
            normalized_4.y = rVar8.w;
            *(ushort *)dst =
                 (ushort)(byte)(int)dVar4 << 0xb | (ushort)(byte)(int)dVar5 << 6 |
                 (ushort)(byte)(int)dVar6 << 1 | (ushort)(0.19607843 < normalized_4.y);
            break;
          case RF_UNCOMPRESSED_R4G4B4A4:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            normalized_6.w = rVar8.x;
            dVar4 = round((double)(normalized_6.w * 15.0));
            _a_1 = rVar8.y;
            dVar5 = round((double)(_a_1 * 15.0));
            normalized_5.x = rVar8.z;
            dVar6 = round((double)(normalized_5.x * 15.0));
            normalized_5.y = rVar8.w;
            dVar7 = round((double)(normalized_5.y * 15.0));
            *(ushort *)dst =
                 (ushort)(byte)(int)dVar4 << 0xc | (ushort)(byte)(int)dVar5 << 8 |
                 (ushort)(byte)(int)dVar6 << 4 | (ushort)(byte)(int)dVar7;
            break;
          case RF_UNCOMPRESSED_R8G8B8A8:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            normalized_7.z = rVar8.x;
            *(char *)dst = (char)(int)(normalized_7.z * 255.0);
            normalized_7.w = rVar8.y;
            *(char *)((long)dst + 1) = (char)(int)(normalized_7.w * 255.0);
            normalized_6.x = rVar8.z;
            *(char *)((long)dst + 2) = (char)(int)(normalized_6.x * 255.0);
            normalized_6.y = rVar8.w;
            *(char *)((long)dst + 3) = (char)(int)(normalized_6.y * 255.0);
            break;
          case RF_UNCOMPRESSED_R32:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            normalized_8.z = rVar8.x;
            normalized_8.w = rVar8.y;
            normalized_7.x = rVar8.z;
            *(float *)dst = normalized_7.x * 0.114 + normalized_8.z * 0.299 + normalized_8.w * 0.587
            ;
            break;
          case RF_UNCOMPRESSED_R32G32B32:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            normalized_9.z = rVar8.x;
            *(float *)dst = normalized_9.z;
            normalized_9.w = rVar8.y;
            *(float *)((long)dst + 4) = normalized_9.w;
            normalized_8.x = rVar8.z;
            *(float *)((long)dst + 8) = normalized_8.x;
            break;
          case RF_UNCOMPRESSED_NORMALIZED:
            rVar8 = rf_format_one_pixel_to_normalized(src,src_format);
            local_e8 = rVar8.x;
            *(float *)dst = local_e8;
            fStack_e4 = rVar8.y;
            *(float *)((long)dst + 4) = fStack_e4;
            normalized_9.x = rVar8.z;
            *(float *)((long)dst + 8) = normalized_9.x;
            normalized_9.y = rVar8.w;
            *(float *)((long)dst + 0xc) = normalized_9.y;
          }
        }
      }
    }
  }
  return;
}

Assistant:

RF_API void rf_format_one_pixel(const void* src, rf_uncompressed_pixel_format src_format, void* dst, rf_uncompressed_pixel_format dst_format)
{
    if (src_format == dst_format && rf_is_uncompressed_format(src_format) && rf_is_uncompressed_format(dst_format))
    {
        memcpy(dst, src, rf_bytes_per_pixel(src_format));
    }
    else if (rf_is_uncompressed_format(src_format) && dst_format == RF_UNCOMPRESSED_R32G32B32A32)
    {
        *((rf_vec4*)dst) = rf_format_one_pixel_to_normalized(src, src_format);
    }
    else if (rf_is_uncompressed_format(src_format) && dst_format == RF_UNCOMPRESSED_R8G8B8A8)
    {
        *((rf_color*)dst) = rf_format_one_pixel_to_rgba32(src, src_format);
    }
    else if (rf_is_uncompressed_format(src_format) && rf_is_uncompressed_format(dst_format))
    {
        switch (dst_format)
        {
            case RF_UNCOMPRESSED_GRAYSCALE:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((unsigned char*)dst)[0] = (unsigned char)((normalized.x * 0.299f + normalized.y * 0.587f + normalized.z * 0.114f) * 255.0f);
            }
            break;

            case RF_UNCOMPRESSED_GRAY_ALPHA:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((unsigned char*)dst)[0    ] = (unsigned char)((normalized.x * 0.299f + (float)normalized.y * 0.587f + (float)normalized.z * 0.114f) * 255.0f);
                ((unsigned char*)dst)[0 + 1] = (unsigned char) (normalized.w * 255.0f);
            }
            break;

            case RF_UNCOMPRESSED_R5G6B5:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                unsigned char r = (unsigned char)(round(normalized.x * 31.0f));
                unsigned char g = (unsigned char)(round(normalized.y * 63.0f));
                unsigned char b = (unsigned char)(round(normalized.z * 31.0f));

                ((unsigned short*)dst)[0] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;
            }
            break;

            case RF_UNCOMPRESSED_R8G8B8:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((unsigned char*)dst)[0    ] = (unsigned char)(normalized.x * 255.0f);
                ((unsigned char*)dst)[0 + 1] = (unsigned char)(normalized.y * 255.0f);
                ((unsigned char*)dst)[0 + 2] = (unsigned char)(normalized.z * 255.0f);
            }
            break;

            case RF_UNCOMPRESSED_R5G5B5A1:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                int ALPHA_THRESHOLD = 50;
                unsigned char r = (unsigned char)(round(normalized.x * 31.0f));
                unsigned char g = (unsigned char)(round(normalized.y * 31.0f));
                unsigned char b = (unsigned char)(round(normalized.z * 31.0f));
                unsigned char a = (normalized.w > ((float)ALPHA_THRESHOLD / 255.0f)) ? 1 : 0;

                ((unsigned short*)dst)[0] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
            }
            break;

            case RF_UNCOMPRESSED_R4G4B4A4:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                unsigned char r = (unsigned char)(round(normalized.x * 15.0f));
                unsigned char g = (unsigned char)(round(normalized.y * 15.0f));
                unsigned char b = (unsigned char)(round(normalized.z * 15.0f));
                unsigned char a = (unsigned char)(round(normalized.w * 15.0f));

                ((unsigned short*)dst)[0] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
            }
            break;

            case RF_UNCOMPRESSED_R8G8B8A8:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((unsigned char*)dst)[0    ] = (unsigned char)(normalized.x * 255.0f);
                ((unsigned char*)dst)[0 + 1] = (unsigned char)(normalized.y * 255.0f);
                ((unsigned char*)dst)[0 + 2] = (unsigned char)(normalized.z * 255.0f);
                ((unsigned char*)dst)[0 + 3] = (unsigned char)(normalized.w * 255.0f);
            }
            break;

            case RF_UNCOMPRESSED_R32:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((float*)dst)[0] = (float)(normalized.x * 0.299f + normalized.y * 0.587f + normalized.z * 0.114f);
            }
            break;

            case RF_UNCOMPRESSED_R32G32B32:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((float*)dst)[0    ] = normalized.x;
                ((float*)dst)[0 + 1] = normalized.y;
                ((float*)dst)[0 + 2] = normalized.z;
            }
            break;

            case RF_UNCOMPRESSED_R32G32B32A32:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((float*)dst)[0    ] = normalized.x;
                ((float*)dst)[0 + 1] = normalized.y;
                ((float*)dst)[0 + 2] = normalized.z;
                ((float*)dst)[0 + 3] = normalized.w;
            }
            break;

            default: break;
        }
    }
}